

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O0

qpdf_stream_decode_level_e __thiscall
qpdf::Stream::writeStreamJSON
          (Stream *this,int json_version,Writer *jw,qpdf_json_stream_data_e json_data,
          qpdf_stream_decode_level_e decode_level,Pipeline *p,string *data_filename,bool no_data_key
          )

{
  bool bVar1;
  Members *pMVar2;
  ulong uVar3;
  logic_error *plVar4;
  Writer *pWVar5;
  bool bVar6;
  char local_201;
  string local_200;
  string_view local_1e0;
  string local_1d0;
  string local_1b0;
  string_view local_190;
  allocator<char> local_179;
  string local_178;
  allocator<char> local_151;
  string local_150;
  allocator<char> local_129;
  string local_128;
  undefined1 local_108 [8];
  QPDFObjectHandle dict;
  int local_d0;
  bool local_ca;
  bool succeeded;
  int attempt;
  bool filter;
  bool filtered;
  bool buf_pl_ready;
  Pipeline *data_pipeline;
  Pl_Buffer buf_pl;
  Pl_Discard discard;
  Members *s;
  bool no_data_key_local;
  Pipeline *p_local;
  qpdf_stream_decode_level_e decode_level_local;
  qpdf_json_stream_data_e json_data_local;
  Writer *jw_local;
  int json_version_local;
  Stream *this_local;
  
  pMVar2 = stream(this);
  if (json_data < qpdf_sj_file) {
    if (p != (Pipeline *)0x0) {
      plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error
                (plVar4,
                 "QPDF_Stream::writeStreamJSON: pipeline should only be supplied when json_data is file"
                );
      __cxa_throw(plVar4,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
  }
  else if (json_data == qpdf_sj_file) {
    if (p == (Pipeline *)0x0) {
      plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error
                (plVar4,
                 "QPDF_Stream::writeStreamJSON: pipeline must be supplied when json_data is file");
      __cxa_throw(plVar4,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) {
      plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error
                (plVar4,
                 "QPDF_Stream::writeStreamJSON: data_filename must be supplied when json_data is file"
                );
      __cxa_throw(plVar4,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
  }
  discard.super_Pipeline.next_._3_1_ = 0x7b;
  JSON::Writer::writeStart(jw,(char *)((long)&discard.super_Pipeline.next_ + 3));
  if (json_data == qpdf_sj_none) {
    JSON::Writer::writeNext(jw);
    JSON::Writer::operator<<(jw,"\"dict\": ");
    QPDFObjectHandle::writeJSON(&pMVar2->stream_dict,json_version,jw,false);
    discard.super_Pipeline.next_._2_1_ = 0x7d;
    JSON::Writer::writeEnd(jw,(char *)((long)&discard.super_Pipeline.next_ + 2));
    this_local._4_4_ = decode_level;
  }
  else {
    Pl_Discard::Pl_Discard((Pl_Discard *)&buf_pl.m);
    Pl_Buffer::Pl_Buffer((Pl_Buffer *)&data_pipeline,"stream data",(Pipeline *)0x0);
    _attempt = (Pipeline *)&data_pipeline;
    if ((no_data_key) && (json_data == qpdf_sj_inline)) {
      _attempt = (Pipeline *)&buf_pl.m;
    }
    succeeded = false;
    local_ca = false;
    bVar6 = decode_level != qpdf_dl_none;
    p_local._0_4_ = decode_level;
    for (local_d0 = 1; local_d0 < 3; local_d0 = local_d0 + 1) {
      bVar1 = pipeStreamData(this,_attempt,&local_ca,0,(qpdf_stream_decode_level_e)p_local,false,
                             local_d0 == 1);
      if ((bVar1) && ((!bVar6 || ((local_ca & 1U) != 0)))) {
        succeeded = true;
        break;
      }
      bVar6 = false;
      p_local._0_4_ = qpdf_dl_none;
      Pl_Buffer::getString_abi_cxx11_
                ((string *)
                 &dict.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (Pl_Buffer *)&data_pipeline);
      std::__cxx11::string::~string
                ((string *)
                 &dict.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    if ((succeeded & 1U) == 0) {
      plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar4,"QPDF_Stream: failed to get stream data");
      __cxa_throw(plVar4,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    QPDFObjectHandle::unsafeShallowCopy((QPDFObjectHandle *)local_108);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"/Length",&local_129);
    QPDFObjectHandle::removeKey((QPDFObjectHandle *)local_108,&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator(&local_129);
    if ((bVar6) && ((local_ca & 1U) != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"/Filter",&local_151);
      QPDFObjectHandle::removeKey((QPDFObjectHandle *)local_108,&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      std::allocator<char>::~allocator(&local_151);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_178,"/DecodeParms",&local_179);
      QPDFObjectHandle::removeKey((QPDFObjectHandle *)local_108,&local_178);
      std::__cxx11::string::~string((string *)&local_178);
      std::allocator<char>::~allocator(&local_179);
    }
    if (json_data == qpdf_sj_file) {
      pWVar5 = JSON::Writer::writeNext(jw);
      pWVar5 = JSON::Writer::operator<<(pWVar5,"\"datafile\": \"");
      JSON::Writer::encode_string(&local_1b0,data_filename);
      local_190 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1b0);
      pWVar5 = JSON::Writer::operator<<(pWVar5,local_190);
      JSON::Writer::operator<<(pWVar5,"\"");
      std::__cxx11::string::~string((string *)&local_1b0);
      Pl_Buffer::getString_abi_cxx11_(&local_1d0,(Pl_Buffer *)&data_pipeline);
      Pipeline::writeString(p,&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
    }
    else {
      if (json_data != qpdf_sj_inline) {
        plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error
                  (plVar4,"QPDF_Stream::writeStreamJSON : unexpected value of json_data");
        __cxa_throw(plVar4,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      if (!no_data_key) {
        pWVar5 = JSON::Writer::writeNext(jw);
        JSON::Writer::operator<<(pWVar5,"\"data\": \"");
        Pl_Buffer::getString_abi_cxx11_(&local_200,(Pl_Buffer *)&data_pipeline);
        local_1e0 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_200);
        pWVar5 = JSON::Writer::writeBase64(jw,local_1e0);
        JSON::Writer::operator<<(pWVar5,"\"");
        std::__cxx11::string::~string((string *)&local_200);
      }
    }
    pWVar5 = JSON::Writer::writeNext(jw);
    JSON::Writer::operator<<(pWVar5,"\"dict\": ");
    QPDFObjectHandle::writeJSON((QPDFObjectHandle *)local_108,json_version,jw,false);
    local_201 = '}';
    JSON::Writer::writeEnd(jw,&local_201);
    this_local._4_4_ = (qpdf_stream_decode_level_e)p_local;
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_108);
    Pl_Buffer::~Pl_Buffer((Pl_Buffer *)&data_pipeline);
    Pl_Discard::~Pl_Discard((Pl_Discard *)&buf_pl.m);
  }
  return this_local._4_4_;
}

Assistant:

qpdf_stream_decode_level_e
Stream::writeStreamJSON(
    int json_version,
    JSON::Writer& jw,
    qpdf_json_stream_data_e json_data,
    qpdf_stream_decode_level_e decode_level,
    Pipeline* p,
    std::string const& data_filename,
    bool no_data_key)
{
    auto s = stream();
    switch (json_data) {
    case qpdf_sj_none:
    case qpdf_sj_inline:
        if (p != nullptr) {
            throw std::logic_error(
                "QPDF_Stream::writeStreamJSON: pipeline should only be supplied "
                "when json_data is file");
        }
        break;
    case qpdf_sj_file:
        if (p == nullptr) {
            throw std::logic_error(
                "QPDF_Stream::writeStreamJSON: pipeline must be supplied when json_data is file");
        }
        if (data_filename.empty()) {
            throw std::logic_error(
                "QPDF_Stream::writeStreamJSON: data_filename must be supplied "
                "when json_data is file");
        }
        break;
    }

    jw.writeStart('{');

    if (json_data == qpdf_sj_none) {
        jw.writeNext();
        jw << R"("dict": )";
        s->stream_dict.writeJSON(json_version, jw);
        jw.writeEnd('}');
        return decode_level;
    }

    Pl_Discard discard;
    Pl_Buffer buf_pl{"stream data"};
    Pipeline* data_pipeline = &buf_pl;
    if (no_data_key && json_data == qpdf_sj_inline) {
        data_pipeline = &discard;
    }
    // pipeStreamData produced valid data.
    bool buf_pl_ready = false;
    bool filtered = false;
    bool filter = (decode_level != qpdf_dl_none);
    for (int attempt = 1; attempt <= 2; ++attempt) {
        bool succeeded =
            pipeStreamData(data_pipeline, &filtered, 0, decode_level, false, (attempt == 1));
        if (!succeeded || (filter && !filtered)) {
            // Try again
            filter = false;
            decode_level = qpdf_dl_none;
            buf_pl.getString(); // reset buf_pl
        } else {
            buf_pl_ready = true;
            break;
        }
    }
    if (!buf_pl_ready) {
        throw std::logic_error("QPDF_Stream: failed to get stream data");
    }
    // We can use unsafeShallowCopy because we are only touching top-level keys.
    auto dict = s->stream_dict.unsafeShallowCopy();
    dict.removeKey("/Length");
    if (filter && filtered) {
        dict.removeKey("/Filter");
        dict.removeKey("/DecodeParms");
    }
    if (json_data == qpdf_sj_file) {
        jw.writeNext() << R"("datafile": ")" << JSON::Writer::encode_string(data_filename) << "\"";
        p->writeString(buf_pl.getString());
    } else if (json_data == qpdf_sj_inline) {
        if (!no_data_key) {
            jw.writeNext() << R"("data": ")";
            jw.writeBase64(buf_pl.getString()) << "\"";
        }
    } else {
        throw std::logic_error("QPDF_Stream::writeStreamJSON : unexpected value of json_data");
    }

    jw.writeNext() << R"("dict": )";
    dict.writeJSON(json_version, jw);
    jw.writeEnd('}');

    return decode_level;
}